

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O3

_Bool trans_fence_i(DisasContext_conflict12 *ctx,arg_fence_i *a)

{
  _Bool _Var1;
  TCGContext_conflict11 *pTVar2;
  
  _Var1 = ctx->ext_ifencei;
  if (_Var1 == true) {
    pTVar2 = ctx->uc->tcg_ctx;
    tcg_gen_op2_riscv64(pTVar2,INDEX_op_movi_i64,(TCGArg)(pTVar2->cpu_pc + (long)pTVar2),
                        ctx->pc_succ_insn);
    pTVar2 = ctx->uc->tcg_ctx;
    if ((ctx->base).singlestep_enabled == true) {
      gen_exception_debug(pTVar2);
    }
    else {
      tcg_gen_exit_tb_riscv64(pTVar2,(TranslationBlock *)0x0,0);
    }
    (ctx->base).is_jmp = DISAS_NORETURN;
  }
  return _Var1;
}

Assistant:

static bool trans_fence_i(DisasContext *ctx, arg_fence_i *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    if (!ctx->ext_ifencei) {
        return false;
    }

    /*
     * FENCE_I is a no-op in QEMU,
     * however we need to end the translation block
     */
    tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, ctx->pc_succ_insn);
    exit_tb(ctx);
    ctx->base.is_jmp = DISAS_NORETURN;
    return true;
}